

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

char * create_hostcache_id(char *name,int port)

{
  int iVar1;
  byte *pbVar2;
  bool bVar3;
  byte *local_28;
  char *ptr;
  char *id;
  int port_local;
  char *name_local;
  
  pbVar2 = (byte *)curl_maprintf("%s:%d",name,(ulong)(uint)port);
  local_28 = pbVar2;
  if (pbVar2 != (byte *)0x0) {
    while( true ) {
      bVar3 = false;
      if (*local_28 != 0) {
        bVar3 = *local_28 != 0x3a;
      }
      if (!bVar3) break;
      iVar1 = tolower((uint)*local_28);
      *local_28 = (byte)iVar1;
      local_28 = local_28 + 1;
    }
  }
  return (char *)pbVar2;
}

Assistant:

static char *
create_hostcache_id(const char *name, int port)
{
  /* create and return the new allocated entry */
  char *id = aprintf("%s:%d", name, port);
  char *ptr = id;
  if(ptr) {
    /* lower case the name part */
    while(*ptr && (*ptr != ':')) {
      *ptr = (char)TOLOWER(*ptr);
      ptr++;
    }
  }
  return id;
}